

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O0

bool __thiscall
cmExportCommand::InitialPass
          (cmExportCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  size_type sVar4;
  const_reference pvVar5;
  string *psVar6;
  char *pcVar7;
  cmGlobalGenerator *this_00;
  cmExportSet *pcVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  cmTarget *this_01;
  ostream *poVar10;
  cmExportBuildFileGenerator *pcVar11;
  reference pbVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1000;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ff8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ff0;
  const_iterator ci;
  value_type local_fe0;
  string local_fc0;
  undefined1 local_fa0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string local_f80;
  cmExportBuildFileGenerator *local_f60;
  cmExportBuildFileGenerator *ebfg;
  string local_f50;
  cmExportBuildFileGenerator *local_f30;
  cmExportBuildFileGenerator *ebfg_1;
  undefined1 local_f08 [8];
  ostringstream e_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d70;
  string local_d50;
  undefined1 local_d30 [8];
  ostringstream e_6;
  cmTarget *target;
  undefined1 local_b90 [8];
  ostringstream e_5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a18;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a10;
  const_iterator currentTarget;
  undefined1 local_9e8 [8];
  ostringstream e_4;
  _Self local_870;
  _Self local_868;
  undefined1 local_860 [8];
  string setName;
  cmExportSetMap *setMap;
  undefined1 local_818 [8];
  ostringstream e_3;
  string local_6a0;
  undefined1 local_680 [8];
  ostringstream e_2;
  cmGlobalGenerator *gg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  allocator local_4a1;
  undefined1 local_4a0 [8];
  string dir;
  undefined1 local_460 [8];
  ostringstream e_1;
  string local_2e8;
  undefined1 local_2c8 [8];
  ostringstream e;
  allocator local_149;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator local_e1;
  string local_e0;
  undefined1 local_c0 [8];
  string fname;
  string local_98;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmExportCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"called with too few arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_00604edf;
  }
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  bVar2 = std::operator==(pvVar5,"PACKAGE");
  if (bVar2) {
    this_local._7_1_ =
         HandlePackage(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local);
    goto LAB_00604edf;
  }
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  bVar2 = std::operator==(pvVar5,"EXPORT");
  if (bVar2) {
    cmCommandArgument::Follows
              (&(this->ExportSetName).super_cmCommandArgument,(cmCommandArgument *)0x0);
    cmCommandArgumentGroup::Follows
              (&this->ArgumentGroup,&(this->ExportSetName).super_cmCommandArgument);
  }
  else {
    cmCommandArgument::Follows(&(this->Targets).super_cmCommandArgument,(cmCommandArgument *)0x0);
    cmCommandArgumentGroup::Follows(&this->ArgumentGroup,&(this->Targets).super_cmCommandArgument);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78);
  cmCommandArgumentsHelper::Parse
            (&(this->super_cmCommand).Helper,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)param_2_local,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_78);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_78);
  if (bVar2) {
    std::__cxx11::string::string((string *)local_c0);
    bVar2 = cmCommandArgument::WasFound(&(this->Filename).super_cmCommandArgument);
    if (bVar2) {
      pcVar7 = cmCAString::GetCString(&this->Filename);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_148,pcVar7,&local_149);
      cmsys::SystemTools::GetFilenameLastExtension(&local_128,&local_148);
      bVar2 = std::operator!=(&local_128,".cmake");
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      if (!bVar2) {
        psVar6 = cmCAString::GetString_abi_cxx11_(&this->Filename);
        std::__cxx11::string::operator=((string *)local_c0,(string *)psVar6);
        goto LAB_00603d71;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
      poVar10 = std::operator<<((ostream *)local_2c8,"FILE option given filename \"");
      psVar6 = cmCAString::GetString_abi_cxx11_(&this->Filename);
      poVar10 = std::operator<<(poVar10,(string *)psVar6);
      std::operator<<(poVar10,"\" which does not have an extension of \".cmake\".\n");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      this_local._7_1_ = 0;
      fname.field_2._8_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,0);
      bVar2 = std::operator!=(pvVar5,"EXPORT");
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_e0,"FILE <filename> option missing.",&local_e1);
        cmCommand::SetError(&this->super_cmCommand,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        this_local._7_1_ = 0;
        fname.field_2._8_4_ = 1;
      }
      else {
        psVar6 = cmCAString::GetString_abi_cxx11_(&this->ExportSetName);
        std::operator+(&local_108,psVar6,".cmake");
        std::__cxx11::string::operator=((string *)local_c0,(string *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
LAB_00603d71:
        pcVar7 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar7);
        if (bVar2) {
          pcVar1 = (this->super_cmCommand).Makefile;
          pcVar7 = (char *)std::__cxx11::string::c_str();
          bVar2 = cmMakefile::CanIWriteThisFile(pcVar1,pcVar7);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
            poVar10 = std::operator<<((ostream *)local_460,"FILE option given filename \"");
            poVar10 = std::operator<<(poVar10,(string *)local_c0);
            std::operator<<(poVar10,"\" which is in the source tree.\n");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)((long)&dir.field_2 + 8));
            std::__cxx11::string::~string((string *)(dir.field_2._M_local_buf + 8));
            this_local._7_1_ = 0;
            fname.field_2._8_4_ = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
            goto LAB_00604ead;
          }
        }
        else {
          pcVar7 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_4a0,pcVar7,&local_4a1);
          std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4a0,"/");
          std::operator+(&local_4c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c0);
          std::__cxx11::string::operator=((string *)local_c0,(string *)&local_4c8);
          std::__cxx11::string::~string((string *)&local_4c8);
          std::__cxx11::string::~string
                    ((string *)
                     &targets.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string((string *)local_4a0);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&gg);
        this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,0);
        bVar2 = std::operator==(pvVar5,"EXPORT");
        if (bVar2) {
          bVar2 = cmCAEnabler::IsEnabled(&this->Append);
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_680);
            std::operator<<((ostream *)local_680,
                            "EXPORT signature does not recognise the APPEND option.");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,&local_6a0);
            std::__cxx11::string::~string((string *)&local_6a0);
            this_local._7_1_ = 0;
            fname.field_2._8_4_ = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_680);
          }
          else {
            bVar2 = cmCAEnabler::IsEnabled(&this->ExportOld);
            if (bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_818);
              std::operator<<((ostream *)local_818,
                              "EXPORT signature does not recognise the EXPORT_LINK_INTERFACE_LIBRARIES option."
                             );
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,(string *)&setMap);
              std::__cxx11::string::~string((string *)&setMap);
              this_local._7_1_ = 0;
              fname.field_2._8_4_ = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_818);
            }
            else {
              setName.field_2._8_8_ = cmGlobalGenerator::GetExportSets(this_00);
              psVar6 = cmCAString::GetString_abi_cxx11_(&this->ExportSetName);
              std::__cxx11::string::string((string *)local_860,(string *)psVar6);
              local_868._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                           *)setName.field_2._8_8_,(key_type *)local_860);
              local_870._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                          *)setName.field_2._8_8_);
              bVar2 = std::operator==(&local_868,&local_870);
              if (bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9e8);
                poVar10 = std::operator<<((ostream *)local_9e8,"Export set \"");
                poVar10 = std::operator<<(poVar10,(string *)local_860);
                std::operator<<(poVar10,"\" not found.");
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,(string *)&currentTarget);
                std::__cxx11::string::~string((string *)&currentTarget);
                this_local._7_1_ = 0;
                fname.field_2._8_4_ = 1;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9e8);
              }
              else {
                pcVar8 = cmExportSetMap::operator[]
                                   ((cmExportSetMap *)setName.field_2._8_8_,(string *)local_860);
                this->ExportSet = pcVar8;
                fname.field_2._8_4_ = 0;
              }
              std::__cxx11::string::~string((string *)local_860);
              if (fname.field_2._8_4_ == 0) goto LAB_00604a7e;
            }
          }
        }
        else {
          bVar2 = cmCommandArgument::WasFound(&(this->Targets).super_cmCommandArgument);
          if (bVar2) {
            pvVar9 = cmCAStringVector::GetVector_abi_cxx11_(&this->Targets);
            local_a10._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar9);
            while( true ) {
              pvVar9 = cmCAStringVector::GetVector_abi_cxx11_(&this->Targets);
              local_a18._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(pvVar9);
              bVar2 = __gnu_cxx::operator!=(&local_a10,&local_a18);
              if (!bVar2) break;
              pcVar1 = (this->super_cmCommand).Makefile;
              pbVar12 = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_a10);
              bVar2 = cmMakefile::IsAlias(pcVar1,pbVar12);
              if (bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b90);
                poVar10 = std::operator<<((ostream *)local_b90,"given ALIAS target \"");
                pbVar12 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_a10);
                poVar10 = std::operator<<(poVar10,(string *)pbVar12);
                std::operator<<(poVar10,"\" which may not be exported.");
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,(string *)&target);
                std::__cxx11::string::~string((string *)&target);
                this_local._7_1_ = 0;
                fname.field_2._8_4_ = 1;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b90);
                goto LAB_00604e91;
              }
              pbVar12 = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_a10);
              this_01 = cmGlobalGenerator::FindTarget(this_00,pbVar12,false);
              if (this_01 == (cmTarget *)0x0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f08);
                poVar10 = std::operator<<((ostream *)local_f08,"given target \"");
                pbVar12 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_a10);
                poVar10 = std::operator<<(poVar10,(string *)pbVar12);
                std::operator<<(poVar10,"\" which is not built by this project.");
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,(string *)&ebfg_1);
                std::__cxx11::string::~string((string *)&ebfg_1);
                this_local._7_1_ = 0;
                fname.field_2._8_4_ = 1;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f08);
                goto LAB_00604e91;
              }
              TVar3 = cmTarget::GetType(this_01);
              if (TVar3 == OBJECT_LIBRARY) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d30);
                poVar10 = std::operator<<((ostream *)local_d30,"given OBJECT library \"");
                pbVar12 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_a10);
                poVar10 = std::operator<<(poVar10,(string *)pbVar12);
                std::operator<<(poVar10,"\" which may not be exported.");
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,&local_d50);
                std::__cxx11::string::~string((string *)&local_d50);
                this_local._7_1_ = 0;
                fname.field_2._8_4_ = 1;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d30);
                goto LAB_00604e91;
              }
              TVar3 = cmTarget::GetType(this_01);
              if (TVar3 == UTILITY) {
                pbVar12 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_a10);
                std::operator+(&local_d90,"given custom target \"",pbVar12);
                std::operator+(&local_d70,&local_d90,"\" which may not be exported.");
                cmCommand::SetError(&this->super_cmCommand,&local_d70);
                std::__cxx11::string::~string((string *)&local_d70);
                std::__cxx11::string::~string((string *)&local_d90);
                this_local._7_1_ = 0;
                fname.field_2._8_4_ = 1;
                goto LAB_00604e91;
              }
              pbVar12 = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_a10);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&gg,pbVar12);
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_a10);
            }
            bVar2 = cmCAEnabler::IsEnabled(&this->Append);
            if ((bVar2) &&
               (local_f30 = cmGlobalGenerator::GetExportedTargetsFile(this_00,(string *)local_c0),
               local_f30 != (cmExportBuildFileGenerator *)0x0)) {
              cmExportBuildFileGenerator::AppendTargets
                        (local_f30,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&gg);
              this_local._7_1_ = 1;
              fname.field_2._8_4_ = 1;
            }
            else {
LAB_00604a7e:
              pcVar11 = (cmExportBuildFileGenerator *)operator_new(0x140);
              cmExportBuildFileGenerator::cmExportBuildFileGenerator(pcVar11);
              local_f60 = pcVar11;
              pcVar7 = (char *)std::__cxx11::string::c_str();
              cmExportFileGenerator::SetExportFile((cmExportFileGenerator *)pcVar11,pcVar7);
              pcVar11 = local_f60;
              pcVar7 = cmCAString::GetCString(&this->Namespace);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_f80,pcVar7,
                         (allocator *)
                         ((long)&configurationTypes.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              cmExportFileGenerator::SetNamespace(&pcVar11->super_cmExportFileGenerator,&local_f80);
              std::__cxx11::string::~string((string *)&local_f80);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&configurationTypes.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              pcVar11 = local_f60;
              bVar2 = cmCAEnabler::IsEnabled(&this->Append);
              cmExportBuildFileGenerator::SetAppendMode(pcVar11,bVar2);
              if (this->ExportSet == (cmExportSet *)0x0) {
                cmExportBuildFileGenerator::SetTargets
                          (local_f60,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&gg);
              }
              else {
                cmExportBuildFileGenerator::SetExportSet(local_f60,this->ExportSet);
              }
              cmMakefile::AddExportBuildFileGenerator((this->super_cmCommand).Makefile,local_f60);
              pcVar11 = local_f60;
              bVar2 = cmCAEnabler::IsEnabled(&this->ExportOld);
              cmExportFileGenerator::SetExportOld(&pcVar11->super_cmExportFileGenerator,bVar2);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_fa0);
              cmMakefile::GetConfigurations
                        (&local_fc0,(this->super_cmCommand).Makefile,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_fa0,true);
              std::__cxx11::string::~string((string *)&local_fc0);
              bVar2 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_fa0);
              if (bVar2) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_fe0,"",(allocator *)((long)&ci._M_current + 7));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_fa0,&local_fe0);
                std::__cxx11::string::~string((string *)&local_fe0);
                std::allocator<char>::~allocator((allocator<char> *)((long)&ci._M_current + 7));
              }
              local_ff8._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_fa0);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ::__normal_iterator<std::__cxx11::string*>
                        ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          *)&local_ff0,&local_ff8);
              while( true ) {
                local_1000._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_fa0);
                bVar2 = __gnu_cxx::operator!=(&local_ff0,&local_1000);
                pcVar11 = local_f60;
                if (!bVar2) break;
                pbVar12 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_ff0);
                cmExportFileGenerator::AddConfiguration
                          (&pcVar11->super_cmExportFileGenerator,pbVar12);
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_ff0);
              }
              if (this->ExportSet == (cmExportSet *)0x0) {
                cmGlobalGenerator::AddBuildExportSet(this_00,local_f60);
              }
              else {
                cmGlobalGenerator::AddBuildExportExportSet(this_00,local_f60);
              }
              this_local._7_1_ = 1;
              fname.field_2._8_4_ = 1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_fa0);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_f50,"EXPORT or TARGETS specifier missing.",
                       (allocator *)((long)&ebfg + 7));
            cmCommand::SetError(&this->super_cmCommand,&local_f50);
            std::__cxx11::string::~string((string *)&local_f50);
            std::allocator<char>::~allocator((allocator<char> *)((long)&ebfg + 7));
            this_local._7_1_ = 0;
            fname.field_2._8_4_ = 1;
          }
        }
LAB_00604e91:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gg);
      }
    }
LAB_00604ead:
    std::__cxx11::string::~string((string *)local_c0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_98,"Unknown arguments.",
               (allocator *)(fname.field_2._M_local_buf + 0xf));
    cmCommand::SetError(&this->super_cmCommand,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)(fname.field_2._M_local_buf + 0xf));
    this_local._7_1_ = 0;
    fname.field_2._8_4_ = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
LAB_00604edf:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExportCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with too few arguments");
    return false;
    }

  if(args[0] == "PACKAGE")
    {
    return this->HandlePackage(args);
    }
  else if (args[0] == "EXPORT")
    {
    this->ExportSetName.Follows(0);
    this->ArgumentGroup.Follows(&this->ExportSetName);
    }
  else
    {
    this->Targets.Follows(0);
    this->ArgumentGroup.Follows(&this->Targets);
    }

  std::vector<std::string> unknownArgs;
  this->Helper.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty())
    {
    this->SetError("Unknown arguments.");
    return false;
    }

  std::string fname;
  if(!this->Filename.WasFound())
    {
    if (args[0] != "EXPORT")
      {
      this->SetError("FILE <filename> option missing.");
      return false;
      }
    fname = this->ExportSetName.GetString() + ".cmake";
    }
  else
    {
    // Make sure the file has a .cmake extension.
    if(cmSystemTools::GetFilenameLastExtension(this->Filename.GetCString())
      != ".cmake")
      {
      std::ostringstream e;
      e << "FILE option given filename \"" << this->Filename.GetString()
        << "\" which does not have an extension of \".cmake\".\n";
      this->SetError(e.str());
      return false;
      }
    fname = this->Filename.GetString();
    }

  // Get the file to write.
  if(cmSystemTools::FileIsFullPath(fname.c_str()))
    {
    if(!this->Makefile->CanIWriteThisFile(fname.c_str()))
      {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      this->SetError(e.str());
      return false;
      }
    }
  else
    {
    // Interpret relative paths with respect to the current build dir.
    std::string dir = this->Makefile->GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
    }

  std::vector<std::string> targets;

  cmGlobalGenerator *gg = this->Makefile->GetGlobalGenerator();

  if(args[0] == "EXPORT")
    {
    if (this->Append.IsEnabled())
      {
      std::ostringstream e;
      e << "EXPORT signature does not recognise the APPEND option.";
      this->SetError(e.str());
      return false;
      }

    if (this->ExportOld.IsEnabled())
      {
      std::ostringstream e;
      e << "EXPORT signature does not recognise the "
        "EXPORT_LINK_INTERFACE_LIBRARIES option.";
      this->SetError(e.str());
      return false;
      }

    cmExportSetMap &setMap = gg->GetExportSets();
    std::string setName = this->ExportSetName.GetString();
    if (setMap.find(setName) == setMap.end())
      {
      std::ostringstream e;
      e << "Export set \"" << setName << "\" not found.";
      this->SetError(e.str());
      return false;
      }
    this->ExportSet = setMap[setName];
    }
  else if (this->Targets.WasFound())
    {
    for(std::vector<std::string>::const_iterator
        currentTarget = this->Targets.GetVector().begin();
        currentTarget != this->Targets.GetVector().end();
        ++currentTarget)
      {
      if (this->Makefile->IsAlias(*currentTarget))
        {
        std::ostringstream e;
        e << "given ALIAS target \"" << *currentTarget
          << "\" which may not be exported.";
        this->SetError(e.str());
        return false;
        }

      if(cmTarget* target = gg->FindTarget(*currentTarget))
        {
        if(target->GetType() == cmState::OBJECT_LIBRARY)
          {
          std::ostringstream e;
          e << "given OBJECT library \"" << *currentTarget
            << "\" which may not be exported.";
          this->SetError(e.str());
          return false;
          }
        if (target->GetType() == cmState::UTILITY)
          {
          this->SetError("given custom target \"" + *currentTarget
                         + "\" which may not be exported.");
          return false;
          }
        }
      else
        {
        std::ostringstream e;
        e << "given target \"" << *currentTarget
          << "\" which is not built by this project.";
        this->SetError(e.str());
        return false;
        }
      targets.push_back(*currentTarget);
      }
    if (this->Append.IsEnabled())
      {
      if (cmExportBuildFileGenerator *ebfg = gg->GetExportedTargetsFile(fname))
        {
        ebfg->AppendTargets(targets);
        return true;
        }
      }
    }
  else
    {
    this->SetError("EXPORT or TARGETS specifier missing.");
    return false;
    }

  // Setup export file generation.
  cmExportBuildFileGenerator *ebfg = new cmExportBuildFileGenerator;
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(this->Namespace.GetCString());
  ebfg->SetAppendMode(this->Append.IsEnabled());
  if (this->ExportSet)
    {
    ebfg->SetExportSet(this->ExportSet);
    }
  else
    {
    ebfg->SetTargets(targets);
    }
  this->Makefile->AddExportBuildFileGenerator(ebfg);
  ebfg->SetExportOld(this->ExportOld.IsEnabled());

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes;
  this->Makefile->GetConfigurations(configurationTypes);
  if(configurationTypes.empty())
    {
    configurationTypes.push_back("");
    }
  for(std::vector<std::string>::const_iterator
        ci = configurationTypes.begin();
      ci != configurationTypes.end(); ++ci)
    {
    ebfg->AddConfiguration(*ci);
    }
  if (this->ExportSet)
    {
    gg->AddBuildExportExportSet(ebfg);
    }
  else
    {
    gg->AddBuildExportSet(ebfg);
    }

  return true;
}